

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_custom.c
# Opt level: O2

size_t log_policy_format_custom_deserialize
                 (log_policy policy,log_record record,void *buffer,size_t size)

{
  undefined8 uVar1;
  code *pcVar2;
  log_level_id level;
  undefined8 *puVar3;
  time_t *__timer;
  char *pcVar4;
  uint64_t uVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  log_record_va_list_type *plVar11;
  
  puVar3 = (undefined8 *)log_policy_instance(policy);
  uVar1 = *puVar3;
  pcVar2 = (code *)puVar3[3];
  __timer = log_record_time(record);
  pcVar4 = ctime(__timer);
  uVar5 = log_record_thread_id(record);
  sVar6 = log_record_line(record);
  pcVar7 = log_record_func(record);
  pcVar8 = log_record_file(record);
  level = log_record_level(record);
  pcVar9 = log_level_to_string(level);
  pcVar10 = log_record_message(record);
  plVar11 = log_record_variable_args(record);
  sVar6 = (*pcVar2)(uVar1,buffer,size,pcVar4,uVar5,sVar6,pcVar7,pcVar8,pcVar9,pcVar10,plVar11);
  return sVar6;
}

Assistant:

static size_t log_policy_format_custom_deserialize(log_policy policy, log_record record, const void *buffer, const size_t size)
{
	log_policy_format_custom_data custom_data = log_policy_instance(policy);

	return custom_data->format_deserialize(custom_data->context, buffer, size,
		ctime(log_record_time(record)),
		log_record_thread_id(record),
		log_record_line(record),
		log_record_func(record),
		log_record_file(record),
		log_level_to_string(log_record_level(record)),
		log_record_message(record),
		(log_policy_format_custom_va_list)log_record_variable_args(record));
}